

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall ArgsManager::GetArg(ArgsManager *this,string *strArg)

{
  long lVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  long in_FS_OFFSET;
  SettingsValue value;
  UniValue *in_stack_ffffffffffffff58;
  SettingsValue *value_00;
  _Alloc_hider in_stack_ffffffffffffffa8;
  ArgsManager *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value_00 = (SettingsValue *)&stack0xffffffffffffffa0;
  GetSetting(in_stack_ffffffffffffffb0,(string *)in_stack_ffffffffffffffa8._M_p);
  SettingToString_abi_cxx11_(value_00);
  UniValue::~UniValue(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> ArgsManager::GetArg(const std::string& strArg) const
{
    const common::SettingsValue value = GetSetting(strArg);
    return SettingToString(value);
}